

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O0

void __thiscall lsim::StringProperty::StringProperty(StringProperty *this,char *key,char *value)

{
  char *pcVar1;
  allocator local_21;
  char *local_20;
  char *value_local;
  char *key_local;
  StringProperty *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (char *)this;
  Property::Property(&this->super_Property,key);
  pcVar1 = local_20;
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__StringProperty_0031c7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_value,pcVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return;
}

Assistant:

StringProperty::StringProperty(const char *key, const char *value) : 
    Property(key),
    m_value(value) {
}